

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.c
# Opt level: O3

uchar * objures(objucxdef *undoctx,uchar cmd,ushort siz)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  
  if (undoctx->objucxsiz < (ushort)(siz + 3)) {
    errsigf(undoctx->objucxerr,"TADS",200);
  }
  uVar1 = undoctx->objucxhead;
  uVar2 = undoctx->objucxprv;
  if (uVar1 == uVar2) {
    undoctx->objucxtop = 0;
    undoctx->objucxtail = 0;
    undoctx->objucxprv = 0;
    uVar1 = 0;
    uVar2 = 0;
  }
  else {
    uVar3 = (uint)(ushort)(siz + 3);
    if (undoctx->objucxtail < uVar1) {
      if ((int)uVar3 <= (int)((uint)undoctx->objucxsiz - (uint)uVar1)) goto LAB_0012e122;
      undoctx->objucxtop = uVar2;
      undoctx->objucxhead = 0;
      uVar1 = 0;
    }
    if ((int)((uint)undoctx->objucxtail - (uint)uVar1) < (int)uVar3) {
      do {
        objutadv(undoctx);
        uVar1 = undoctx->objucxhead;
        if (undoctx->objucxtail <= uVar1) {
          uVar2 = undoctx->objucxprv;
          if ((int)uVar3 <= (int)((uint)undoctx->objucxsiz - (uint)uVar1)) goto LAB_0012e122;
          undoctx->objucxtop = uVar2;
          undoctx->objucxhead = 0;
          uVar1 = 0;
        }
      } while ((int)((uint)undoctx->objucxtail - (uint)uVar1) < (int)uVar3);
      uVar2 = undoctx->objucxprv;
    }
  }
LAB_0012e122:
  undoctx->objucxprv = uVar1;
  undoctx->objucxbuf[uVar1] = cmd;
  *(ushort *)(undoctx->objucxbuf + (ulong)uVar1 + 1) = uVar2;
  undoctx->objucxhead = uVar1 + 3;
  if (undoctx->objucxtop < uVar1) {
    undoctx->objucxtop = uVar1;
  }
  return undoctx->objucxbuf + (ushort)(uVar1 + 3);
}

Assistant:

uchar *objures(objucxdef *undoctx, uchar cmd, ushort siz)
{
    ushort  prv;
    uchar  *p;
    
    /* adjust size to include header information */
    siz += 1 + sizeof(ushort);
    
    /* make sure there's enough room overall for the record */
    if (siz > undoctx->objucxsiz) errsig(undoctx->objucxerr, ERR_UNDOVF);
    
    /* if there's no information, reset buffers */
    if (undoctx->objucxhead == undoctx->objucxprv)
    {
        undoctx->objucxhead = undoctx->objucxprv = undoctx->objucxtail = 0;
        undoctx->objucxtop = 0;
        goto done;
    }
    
    /* if tail is below head, we can use to top of entire buffer */
    if (undoctx->objucxtail < undoctx->objucxhead)
    {
        /* if there's enough space left after head, we're done */
        if (undoctx->objucxsiz - undoctx->objucxhead >= siz)
            goto done;
        
        /* insufficient space:  wrap head down to bottom of buffer */
        undoctx->objucxtop = undoctx->objucxprv;            /* last was top */
        undoctx->objucxhead = 0;
    }
    
    /* head is below tail:  delete records until we have enough room */
    while (undoctx->objucxtail - undoctx->objucxhead < siz)
    {
        objutadv(undoctx);
        
        /* if the tail wrapped, advancing won't do any more good */
        if (undoctx->objucxtail <= undoctx->objucxhead)
        {
            /* if there's enough room at the top, we're done */
            if (undoctx->objucxsiz - undoctx->objucxhead >= siz)
                goto done;
            
            /* still not enough room; wrap the head this time */
            undoctx->objucxtop = undoctx->objucxprv;        /* last was top */
            undoctx->objucxhead = 0;
        }
    }
    
done:
    /* save back-link, and set objucxprv pointer to the new record */
    prv = undoctx->objucxprv;
    undoctx->objucxprv = undoctx->objucxhead;
    
    /* write the header:  command byte, back-link to previous record */
    p = &undoctx->objucxbuf[undoctx->objucxhead];
    *p++ = cmd;
    memcpy(p, &prv, sizeof(prv));
    
    /* advance the head pointer past the header */
    undoctx->objucxhead += 1 + sizeof(prv);
    
    /* set the high-water mark if we've exceeded the old one */
    if (undoctx->objucxprv > undoctx->objucxtop)
        undoctx->objucxtop = undoctx->objucxprv;

    /* return the reserved space */
    return &undoctx->objucxbuf[undoctx->objucxhead];
}